

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O1

_Bool duckdb_je_ckh_iter(ckh_t *ckh,size_t *tabind,void **key,void **data)

{
  byte bVar1;
  ulong uVar2;
  ckhc_t *pcVar3;
  void *pvVar4;
  _Bool _Var5;
  
  uVar2 = *tabind;
  bVar1 = (char)ckh->lg_curbuckets + 2;
  _Var5 = uVar2 >> (bVar1 & 0x3f) != 0;
  if (_Var5) {
    return _Var5;
  }
  pvVar4 = ckh->tab[uVar2].key;
  if (pvVar4 == (void *)0x0) {
    pcVar3 = ckh->tab + uVar2;
    do {
      pcVar3 = pcVar3 + 1;
      uVar2 = uVar2 + 1;
      _Var5 = uVar2 >> (bVar1 & 0x3f) != 0;
      if (_Var5) {
        return _Var5;
      }
      pvVar4 = pcVar3->key;
    } while (pvVar4 == (void *)0x0);
  }
  if (key != (void **)0x0) {
    *key = pvVar4;
  }
  if (data != (void **)0x0) {
    *data = ckh->tab[uVar2].data;
  }
  *tabind = uVar2 + 1;
  return _Var5;
}

Assistant:

bool
ckh_iter(ckh_t *ckh, size_t *tabind, void **key, void **data) {
	size_t i, ncells;

	for (i = *tabind, ncells = (ZU(1) << (ckh->lg_curbuckets +
	    LG_CKH_BUCKET_CELLS)); i < ncells; i++) {
		if (ckh->tab[i].key != NULL) {
			if (key != NULL) {
				*key = (void *)ckh->tab[i].key;
			}
			if (data != NULL) {
				*data = (void *)ckh->tab[i].data;
			}
			*tabind = i + 1;
			return false;
		}
	}

	return true;
}